

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

error_code llvm::errorToErrorCode(Error *Err)

{
  __uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> _Var1;
  int iVar2;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var3;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var4;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var5;
  Error EVar6;
  ErrorInfoBase *pEVar7;
  undefined1 auVar8 [16];
  error_code eVar9;
  undefined1 local_78 [8];
  error_code EC;
  anon_class_8_1_3fcf615c local_60;
  Error local_58;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_50;
  _Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_> local_48;
  __uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_40;
  Error local_38;
  
  local_78._0_4_ = 0;
  auVar8 = std::_V2::system_category();
  EC._0_8_ = auVar8._0_8_;
  pEVar7 = Err->Payload;
  Err->Payload = (ErrorInfoBase *)0x0;
  _Var4._M_head_impl = (ErrorInfoBase *)((ulong)pEVar7 & 0xfffffffffffffffe);
  local_60.EC = (error_code *)local_78;
  if (_Var4._M_head_impl != (ErrorInfoBase *)0x0) goto LAB_00b5f093;
  local_38.Payload = (ErrorInfoBase *)0x1;
LAB_00b5f073:
  cantFail(&local_38,(char *)0x0);
  if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
  }
  eVar9 = inconvertibleErrorCode();
  auVar8._8_8_ = eVar9._M_cat;
  auVar8._0_8_ = EC._0_8_;
LAB_00b5f093:
  EC._0_8_ = auVar8._0_8_;
  iVar2 = (*(_Var4._M_head_impl)->_vptr_ErrorInfoBase[6])
                    (_Var4._M_head_impl,&ErrorList::ID,auVar8._8_8_);
  if ((char)iVar2 == '\0') goto LAB_00b5f144;
  _Var5._M_head_impl = (ErrorInfoBase *)_Var4._M_head_impl[2]._vptr_ErrorInfoBase;
  EVar6.Payload = (ErrorInfoBase *)0x1;
  local_48.super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
       (_Head_base<0UL,_llvm::ErrorInfoBase_*,_false>)
       (_Head_base<0UL,_llvm::ErrorInfoBase_*,_false>)_Var4._M_head_impl;
  for (pEVar7 = (ErrorInfoBase *)_Var4._M_head_impl[1]._vptr_ErrorInfoBase;
      _Var3._M_head_impl =
           (ErrorInfoBase *)
           local_48.super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl,
      pEVar7 != _Var5._M_head_impl; pEVar7 = pEVar7 + 1) {
    local_50._M_head_impl = (ErrorInfoBase *)pEVar7->_vptr_ErrorInfoBase;
    pEVar7->_vptr_ErrorInfoBase = (_func_int **)0x0;
    local_58.Payload = EVar6.Payload;
    handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
              ((llvm *)&EC._M_cat,
               (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
               &local_50,&local_60);
    ErrorList::join((ErrorList *)&local_40,&local_58,(Error *)&EC._M_cat);
    _Var1._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         local_40._M_t.
         super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
         super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    local_40._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
         (_Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)0x0;
    if ((long *)((ulong)EC._M_cat & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)EC._M_cat & 0xfffffffffffffffe) + 8))();
    }
    if (local_50._M_head_impl != (ErrorInfoBase *)0x0) {
      (*(local_50._M_head_impl)->_vptr_ErrorInfoBase[1])();
    }
    local_50._M_head_impl = (ErrorInfoBase *)0x0;
    if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
    }
    EVar6.Payload =
         (ErrorInfoBase *)
         ((ulong)_Var1._M_t.
                 super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                 .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl | 1);
  }
  goto LAB_00b5f16f;
LAB_00b5f144:
  local_40._M_t.
  super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
  super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
       (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
       (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)_Var4._M_head_impl;
  handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
            ((llvm *)&local_38,
             (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)&local_40
             ,&local_60);
  _Var3._M_head_impl =
       (ErrorInfoBase *)
       local_40._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  _Var5._M_head_impl = _Var4._M_head_impl;
  EVar6.Payload = local_38.Payload;
  if ((_Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl != (ErrorInfoBase *)0x0) {
LAB_00b5f16f:
    local_38.Payload = EVar6.Payload;
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ErrorInfoBase + 8))();
    _Var4._M_head_impl = _Var5._M_head_impl;
  }
  goto LAB_00b5f073;
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}